

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotRecord.h
# Opt level: O2

Entry * __thiscall
cali::SnapshotView::get_immediate_entry
          (Entry *__return_storage_ptr__,SnapshotView *this,Attribute *attr)

{
  undefined8 *puVar1;
  Entry *pEVar2;
  long lVar3;
  uint64_t uVar4;
  cali_id_t cVar5;
  long lVar6;
  
  if (attr->m_node == (Node *)0x0) {
    cVar5 = 0xffffffffffffffff;
  }
  else {
    cVar5 = attr->m_node->m_id;
  }
  pEVar2 = this->m_data;
  lVar6 = 0;
  while( true ) {
    if (this->m_len * 0x18 - lVar6 == 0) {
      __return_storage_ptr__->m_node = (Node *)0x0;
      (__return_storage_ptr__->m_value).m_v.type_and_size = 0;
      (__return_storage_ptr__->m_value).m_v.value.v_uint = 0;
      return __return_storage_ptr__;
    }
    lVar3 = *(long *)((long)&pEVar2->m_node + lVar6);
    if ((lVar3 != 0) && (*(cali_id_t *)(lVar3 + 0x10) == cVar5)) break;
    lVar6 = lVar6 + 0x18;
  }
  (__return_storage_ptr__->m_value).m_v.value =
       *(anon_union_8_7_33918203_for_value *)((long)&(pEVar2->m_value).m_v.value + lVar6);
  puVar1 = (undefined8 *)((long)&pEVar2->m_node + lVar6);
  uVar4 = puVar1[1];
  __return_storage_ptr__->m_node = (Node *)*puVar1;
  (__return_storage_ptr__->m_value).m_v.type_and_size = uVar4;
  return __return_storage_ptr__;
}

Assistant:

Entry get_immediate_entry(const Attribute& attr) const
    {
        cali_id_t attr_id = attr.id();
        for (const Entry& e : *this) {
            if (e.node() && e.node()->id() == attr_id)
                return e;
        }

        return Entry();
    }